

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O1

void ContextBlockSplitterStoredFinishBlockLiterals
               (ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  BlockSplit *pBVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  HistogramLiteral *pHVar9;
  ulong uVar10;
  void *pvVar11;
  size_t sVar12;
  uint *puVar13;
  void *__src;
  HistogramLiteral *pHVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  void *local_78;
  void *local_70;
  
  pBVar4 = self->split_;
  sVar5 = self->num_contexts_;
  sVar15 = self->num_blocks_;
  pHVar9 = self->histograms_;
  if (sVar15 == 0) {
    self->num_blocks_ = 1;
    self->num_types_ = self->num_types_ + 1;
    uVar6 = self->curr_histogram_ix_ + sVar5;
    self->curr_histogram_ix_ = uVar6;
    if ((uVar6 < *self->histograms_size_) && (sVar5 != 0)) {
      pHVar9 = pHVar9 + uVar6;
      sVar15 = sVar5;
      do {
        memset(pHVar9,0,0x408);
        pHVar9->bit_cost_ = INFINITY;
        pHVar9 = pHVar9 + 1;
        sVar15 = sVar15 - 1;
      } while (sVar15 != 0);
    }
    self->block_size_ = 0;
  }
  else if (self->block_size_ != 0) {
    uVar6 = (ulong)pBVar4->types[sVar15];
    if (pBVar4->num_types <= uVar6) {
      uVar6 = 0;
    }
    uVar10 = self->num_types_;
    if ((uint8_t)uVar6 == (uint8_t)uVar10) {
      if (uVar10 < self->max_block_types_) {
        self->num_blocks_ = sVar15 + 1;
        self->num_types_ = uVar10 + 1;
        uVar6 = self->curr_histogram_ix_ + sVar5;
        self->curr_histogram_ix_ = uVar6;
        if ((uVar6 < *self->histograms_size_) && (sVar5 != 0)) {
          pHVar9 = pHVar9 + uVar6;
          sVar15 = sVar5;
          do {
            memset(pHVar9,0,0x408);
            pHVar9->bit_cost_ = INFINITY;
            pHVar9 = pHVar9 + 1;
            sVar15 = sVar15 - 1;
          } while (sVar15 != 0);
        }
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
      }
      else {
        pBVar4->types[sVar15] = '\0';
        if (sVar5 == 0) {
          local_78 = (void *)0x0;
        }
        else {
          local_78 = BrotliAllocate(m,sVar5 * 0x410);
          sVar15 = 0;
          pvVar11 = local_78;
          pHVar14 = pHVar9;
          do {
            puVar13 = (uint *)(sVar15 * 0x410 + (long)local_78);
            memcpy(puVar13,pHVar9 + sVar15 + self->curr_histogram_ix_,0x410);
            plVar2 = (long *)((long)local_78 + sVar15 * 0x410 + 0x400);
            *plVar2 = *plVar2 + pHVar9[sVar15].total_count_;
            lVar7 = 0;
            do {
              piVar1 = (int *)((long)pvVar11 + lVar7 * 4);
              *piVar1 = *piVar1 + pHVar14->data_[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0x100);
            puVar8 = puVar13 + self->alphabet_size_;
            uVar6 = 0;
            if ((self->alphabet_size_ & 1) != 0) goto LAB_00136baf;
            while (puVar13 < puVar8) {
              uVar3 = *puVar13;
              puVar13 = puVar13 + 1;
              uVar6 = uVar6 + uVar3;
              if (0xff < (ulong)uVar3) {
                log2((double)uVar3);
              }
LAB_00136baf:
              uVar3 = *puVar13;
              puVar13 = puVar13 + 1;
              uVar6 = uVar6 + uVar3;
              if (0xff < (ulong)uVar3) {
                log2((double)uVar3);
              }
            }
            if (0xff < uVar6) {
              auVar17._8_4_ = (int)(uVar6 >> 0x20);
              auVar17._0_8_ = uVar6;
              auVar17._12_4_ = 0x45300000;
              log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
            }
            sVar15 = sVar15 + 1;
            pHVar14 = pHVar14 + 1;
            pvVar11 = (void *)((long)pvVar11 + 0x410);
            sVar12 = sVar5;
            __src = local_78;
          } while (sVar15 != sVar5);
          do {
            memcpy(pHVar9,__src,0x410);
            sVar15 = self->curr_histogram_ix_;
            memset(pHVar9 + sVar15,0,0x408);
            pHVar9[sVar15].bit_cost_ = INFINITY;
            pHVar9 = pHVar9 + 1;
            sVar12 = sVar12 - 1;
            __src = (void *)((long)__src + 0x410);
          } while (sVar12 != 0);
        }
        self->num_blocks_ = self->num_blocks_ + 1;
        pBVar4->num_types = self->num_types_;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        BrotliFree(m,local_78);
      }
    }
    else {
      if (sVar5 == 0) {
        local_70 = (void *)0x0;
      }
      else {
        local_70 = BrotliAllocate(m,sVar5 * 0x410);
        sVar15 = 0;
        pvVar11 = local_70;
        pHVar14 = pHVar9 + sVar5 * uVar6;
        do {
          puVar13 = (uint *)((long)local_70 + sVar15 * 0x410);
          memcpy(puVar13,pHVar9 + sVar15 + self->curr_histogram_ix_,0x410);
          plVar2 = (long *)((long)local_70 + sVar15 * 0x410 + 0x400);
          *plVar2 = *plVar2 + (pHVar9 + sVar5 * uVar6)[sVar15].total_count_;
          lVar7 = 0;
          do {
            piVar1 = (int *)((long)pvVar11 + lVar7 * 4);
            *piVar1 = *piVar1 + pHVar14->data_[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x100);
          puVar8 = puVar13 + self->alphabet_size_;
          uVar10 = 0;
          if ((self->alphabet_size_ & 1) != 0) goto LAB_001369bd;
          while (puVar13 < puVar8) {
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar10 = uVar10 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
LAB_001369bd:
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar10 = uVar10 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
          }
          if (0xff < uVar10) {
            auVar16._8_4_ = (int)(uVar10 >> 0x20);
            auVar16._0_8_ = uVar10;
            auVar16._12_4_ = 0x45300000;
            log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0));
          }
          sVar15 = sVar15 + 1;
          pHVar14 = pHVar14 + 1;
          pvVar11 = (void *)((long)pvVar11 + 0x410);
        } while (sVar15 != sVar5);
      }
      pBVar4->types[self->num_blocks_] = (uint8_t)uVar6;
      if (sVar5 != 0) {
        sVar15 = sVar5;
        pvVar11 = local_70;
        do {
          memcpy(pHVar9 + uVar6 * sVar5,pvVar11,0x410);
          sVar12 = self->curr_histogram_ix_;
          memset(pHVar9 + sVar12,0,0x408);
          pHVar9[sVar12].bit_cost_ = INFINITY;
          pvVar11 = (void *)((long)pvVar11 + 0x410);
          pHVar9 = pHVar9 + 1;
          sVar15 = sVar15 - 1;
        } while (sVar15 != 0);
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      BrotliFree(m,local_70);
    }
  }
  if (is_final != 0) {
    *self->histograms_size_ = sVar5 * pBVar4->num_types;
  }
  return;
}

Assistant:

static void ContextBlockSplitterStoredFinishBlockLiterals(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  HistogramLiteral* histograms = self->histograms_;
  if (self->num_blocks_ == 0) {
    /* Create a first block */
    ++self->num_blocks_;
    ++self->num_types_;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    uint8_t current_type = split->types[self->num_blocks_];
    if (current_type >= split->num_types) {
      current_type = 0;
    }

    if (current_type == (uint8_t)self->num_types_) {
      /* If max_block_types_ amount is reached merge with a block of type 0 */
      if (self->num_types_ >= self->max_block_types_) {
        current_type = 0;
        split->types[self->num_blocks_] = 0;
        /* Merge with the blocks of the same 0 block type */
        HistogramLiteral* combined_histo =
            BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
        double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
        size_t i;
        if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

        for (i = 0; i < num_contexts; ++i) {
          size_t curr_histo_ix = self->curr_histogram_ix_ + i;
          combined_histo[i] = histograms[curr_histo_ix];
          HistogramAddHistogramLiteral(&combined_histo[i],
              &histograms[current_type * num_contexts + i]);
          combined_entropy[i] = BitsEntropy(
              &combined_histo[i].data_[0], self->alphabet_size_);
        }

        for (i = 0; i < num_contexts; ++i) {
          histograms[current_type * num_contexts + i] =
              combined_histo[i];
          HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
        }
        ++self->num_blocks_;
        split->num_types = self->num_types_;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        BROTLI_FREE(m, combined_histo);
      } else {
        /* Create a new block type */
        ++self->num_blocks_;
        ++self->num_types_;
        self->curr_histogram_ix_ += num_contexts;
        if (self->curr_histogram_ix_ < *self->histograms_size_) {
          ClearHistogramsLiteral(
              &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
        }

        self->block_size_ = 0;
        self->merge_last_count_ = 0;
      }
    } else {
      /* Merge with the blocks of the same current_type block type */
      HistogramLiteral* combined_histo =
          BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
      double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
      size_t i;
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

      for (i = 0; i < num_contexts; ++i) {
        size_t curr_histo_ix = self->curr_histogram_ix_ + i;
        combined_histo[i] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[i],
            &histograms[current_type * num_contexts + i]);
        combined_entropy[i] = BitsEntropy(
            &combined_histo[i].data_[0], self->alphabet_size_);
      }
      split->types[self->num_blocks_] = current_type;
      for (i = 0; i < num_contexts; ++i) {
        histograms[current_type * num_contexts + i] =
            combined_histo[i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      BROTLI_FREE(m, combined_histo);
    }
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
  }
}